

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

int AF_AActor_SpawnTeleportFog
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double mobj;
  int iVar1;
  bool bVar2;
  bool local_73;
  TVector3<double> local_70;
  byte local_52;
  byte local_51;
  bool settarget;
  VMValue *pVStack_50;
  bool before;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x65,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x65,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  x = (param->field_0).f;
  local_73 = true;
  if ((DObject *)x != (DObject *)0x0) {
    local_73 = DObject::IsKindOf((DObject *)x,AActor::RegistrationInfo.MyClass);
  }
  mobj = x;
  if (local_73 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x65,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x66,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x66,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  y = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 2;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x67,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x67,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  z = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 3;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x68,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x68,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pVStack_50 = defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 4;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x69,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\0') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x69,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_51 = *(int *)&defaultparam_local[iVar1].Array != 0;
  self._0_4_ = (int)self + 5;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x6a,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[(int)self].Count != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                  ,0x6a,
                  "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_52 = *(int *)&defaultparam_local[(int)self].Array != 0;
  TVector3<double>::TVector3(&local_70,y,z,(double)pVStack_50);
  P_SpawnTeleportFog((AActor *)mobj,&local_70,(bool)(local_51 & 1),(bool)(local_52 & 1));
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnTeleportFog)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(before);
	PARAM_BOOL(settarget);
	P_SpawnTeleportFog(self, DVector3(x, y, z), before, settarget);
	return 0;
}